

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39],kj::StringPtr&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool> *params,char (*params_1) [39],StringPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  char (*params_00) [39];
  StringPtr *params_01;
  long lVar4;
  String argValues [3];
  String *__return_storage_ptr__;
  undefined8 uVar5;
  String local_78;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  __return_storage_ptr__ = &local_78;
  heapString(__return_storage_ptr__,5);
  if ((char *)local_78.content.size_ != (char *)0x0) {
    local_78.content.size_ = (size_t)local_78.content.ptr;
  }
  builtin_strncpy((char *)local_78.content.size_,"false",5);
  str<char_const(&)[39]>(&local_60,(kj *)params_1,params_00);
  str<kj::StringPtr&>(&local_48,(kj *)params_2,params_01);
  uVar5 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,__return_storage_ptr__,uVar5);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}